

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardswish_x86_avx2.cpp
# Opt level: O2

int __thiscall
ncnn::HardSwish_x86_avx2::forward_inplace(HardSwish_x86_avx2 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined4 uVar1;
  float fVar2;
  undefined1 auVar3 [16];
  _func_int **pp_Var4;
  _func_int *p_Var5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  void *pvVar8;
  long lVar9;
  int iVar10;
  undefined1 (*pauVar11) [32];
  int _c;
  int iVar12;
  int iVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  Mat local_78;
  
  iVar13 = bottom_top_blob->c;
  iVar12 = bottom_top_blob->h * bottom_top_blob->w;
  _c = 0;
  if (bottom_top_blob->elempack == 8) {
    if (iVar12 < 1) {
      iVar12 = _c;
    }
    if (iVar13 < 1) {
      iVar13 = 0;
    }
    for (; _c != iVar13; _c = _c + 1) {
      ncnn::Mat::channel(&local_78,bottom_top_blob,_c);
      pauVar11 = (undefined1 (*) [32])local_78.data;
      ncnn::Mat::~Mat(&local_78);
      auVar24._8_4_ = 0x3f800000;
      auVar24._0_8_ = 0x3f8000003f800000;
      auVar24._12_4_ = 0x3f800000;
      auVar24._16_4_ = 0x3f800000;
      auVar24._20_4_ = 0x3f800000;
      auVar24._24_4_ = 0x3f800000;
      auVar24._28_4_ = 0x3f800000;
      pp_Var4 = this->_vptr_HardSwish_x86_avx2;
      iVar10 = iVar12;
      while (bVar14 = iVar10 != 0, iVar10 = iVar10 + -1, bVar14) {
        auVar25 = *pauVar11;
        uVar1 = *(undefined4 *)(&this->field_0xd4 + (long)pp_Var4[-3]);
        auVar18._4_4_ = uVar1;
        auVar18._0_4_ = uVar1;
        auVar18._8_4_ = uVar1;
        auVar18._12_4_ = uVar1;
        auVar18._16_4_ = uVar1;
        auVar18._20_4_ = uVar1;
        auVar18._24_4_ = uVar1;
        auVar18._28_4_ = uVar1;
        uVar1 = *(undefined4 *)(&this->field_0xd0 + (long)pp_Var4[-3]);
        auVar21._4_4_ = uVar1;
        auVar21._0_4_ = uVar1;
        auVar21._8_4_ = uVar1;
        auVar21._12_4_ = uVar1;
        auVar21._16_4_ = uVar1;
        auVar21._20_4_ = uVar1;
        auVar21._24_4_ = uVar1;
        auVar21._28_4_ = uVar1;
        auVar23 = vfmadd213ps_fma(auVar21,auVar25,auVar18);
        auVar18 = vmaxps_avx(ZEXT1632(auVar23),ZEXT1632(ZEXT816(0) << 0x40));
        auVar18 = vminps_avx(auVar18,auVar24);
        auVar6._4_4_ = auVar18._4_4_ * auVar25._4_4_;
        auVar6._0_4_ = auVar18._0_4_ * auVar25._0_4_;
        auVar6._8_4_ = auVar18._8_4_ * auVar25._8_4_;
        auVar6._12_4_ = auVar18._12_4_ * auVar25._12_4_;
        auVar6._16_4_ = auVar18._16_4_ * auVar25._16_4_;
        auVar6._20_4_ = auVar18._20_4_ * auVar25._20_4_;
        auVar6._24_4_ = auVar18._24_4_ * auVar25._24_4_;
        auVar6._28_4_ = auVar25._28_4_;
        *pauVar11 = auVar6;
        pauVar11 = pauVar11 + 1;
      }
    }
  }
  else if (bottom_top_blob->elempack == 4) {
    if (iVar12 < 1) {
      iVar12 = _c;
    }
    if (iVar13 < 1) {
      iVar13 = 0;
    }
    for (; _c != iVar13; _c = _c + 1) {
      ncnn::Mat::channel(&local_78,bottom_top_blob,_c);
      pauVar11 = (undefined1 (*) [32])local_78.data;
      ncnn::Mat::~Mat(&local_78);
      auVar23._8_4_ = 0x3f800000;
      auVar23._0_8_ = 0x3f8000003f800000;
      auVar23._12_4_ = 0x3f800000;
      pp_Var4 = this->_vptr_HardSwish_x86_avx2;
      iVar10 = iVar12;
      while (bVar14 = iVar10 != 0, iVar10 = iVar10 + -1, bVar14) {
        auVar3 = *(undefined1 (*) [16])*pauVar11;
        uVar1 = *(undefined4 *)(&this->field_0xd4 + (long)pp_Var4[-3]);
        auVar17._4_4_ = uVar1;
        auVar17._0_4_ = uVar1;
        auVar17._8_4_ = uVar1;
        auVar17._12_4_ = uVar1;
        uVar1 = *(undefined4 *)(&this->field_0xd0 + (long)pp_Var4[-3]);
        auVar20._4_4_ = uVar1;
        auVar20._0_4_ = uVar1;
        auVar20._8_4_ = uVar1;
        auVar20._12_4_ = uVar1;
        auVar17 = vfmadd213ps_fma(auVar20,auVar3,auVar17);
        auVar17 = vmaxps_avx(auVar17,ZEXT816(0) << 0x40);
        auVar17 = vminps_avx(auVar17,auVar23);
        auVar15._0_4_ = auVar17._0_4_ * auVar3._0_4_;
        auVar15._4_4_ = auVar17._4_4_ * auVar3._4_4_;
        auVar15._8_4_ = auVar17._8_4_ * auVar3._8_4_;
        auVar15._12_4_ = auVar17._12_4_ * auVar3._12_4_;
        *(undefined1 (*) [16])*pauVar11 = auVar15;
        pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
      }
    }
  }
  else {
    if (iVar13 < 1) {
      iVar13 = _c;
    }
    for (; _c != iVar13; _c = _c + 1) {
      ncnn::Mat::channel(&local_78,bottom_top_blob,_c);
      pvVar8 = local_78.data;
      ncnn::Mat::~Mat(&local_78);
      auVar25._8_4_ = 0x3f800000;
      auVar25._0_8_ = 0x3f8000003f800000;
      auVar25._12_4_ = 0x3f800000;
      auVar25._16_4_ = 0x3f800000;
      auVar25._20_4_ = 0x3f800000;
      auVar25._24_4_ = 0x3f800000;
      auVar25._28_4_ = 0x3f800000;
      pp_Var4 = this->_vptr_HardSwish_x86_avx2;
      lVar9 = 0;
      pauVar11 = (undefined1 (*) [32])pvVar8;
      for (iVar10 = 0; iVar10 + 7 < iVar12; iVar10 = iVar10 + 8) {
        auVar24 = *pauVar11;
        uVar1 = *(undefined4 *)(&this->field_0xd4 + (long)pp_Var4[-3]);
        auVar19._4_4_ = uVar1;
        auVar19._0_4_ = uVar1;
        auVar19._8_4_ = uVar1;
        auVar19._12_4_ = uVar1;
        auVar19._16_4_ = uVar1;
        auVar19._20_4_ = uVar1;
        auVar19._24_4_ = uVar1;
        auVar19._28_4_ = uVar1;
        uVar1 = *(undefined4 *)(&this->field_0xd0 + (long)pp_Var4[-3]);
        auVar22._4_4_ = uVar1;
        auVar22._0_4_ = uVar1;
        auVar22._8_4_ = uVar1;
        auVar22._12_4_ = uVar1;
        auVar22._16_4_ = uVar1;
        auVar22._20_4_ = uVar1;
        auVar22._24_4_ = uVar1;
        auVar22._28_4_ = uVar1;
        auVar23 = vfmadd213ps_fma(auVar22,auVar24,auVar19);
        auVar18 = vmaxps_avx(ZEXT1632(auVar23),ZEXT1632(ZEXT816(0) << 0x40));
        auVar18 = vminps_avx(auVar18,auVar25);
        auVar7._4_4_ = auVar18._4_4_ * auVar24._4_4_;
        auVar7._0_4_ = auVar18._0_4_ * auVar24._0_4_;
        auVar7._8_4_ = auVar18._8_4_ * auVar24._8_4_;
        auVar7._12_4_ = auVar18._12_4_ * auVar24._12_4_;
        auVar7._16_4_ = auVar18._16_4_ * auVar24._16_4_;
        auVar7._20_4_ = auVar18._20_4_ * auVar24._20_4_;
        auVar7._24_4_ = auVar18._24_4_ * auVar24._24_4_;
        auVar7._28_4_ = auVar24._28_4_;
        *pauVar11 = auVar7;
        pauVar11 = pauVar11 + 1;
        lVar9 = lVar9 + 8;
      }
      pp_Var4 = this->_vptr_HardSwish_x86_avx2;
      for (; (int)lVar9 < iVar12; lVar9 = lVar9 + 1) {
        fVar2 = *(float *)((undefined1 *)pvVar8 + lVar9 * 4);
        p_Var5 = pp_Var4[-3];
        fVar16 = 0.0;
        if (fVar2 < *(float *)(&this->field_0xd8 + (long)p_Var5)) {
LAB_002c3896:
          *(float *)((undefined1 *)pvVar8 + lVar9 * 4) = fVar16;
        }
        else if (fVar2 <= *(float *)(&this->field_0xdc + (long)p_Var5)) {
          auVar23 = vfmadd213ss_fma(ZEXT416(*(uint *)(&this->field_0xd0 + (long)p_Var5)),
                                    ZEXT416((uint)fVar2),
                                    ZEXT416(*(uint *)(&this->field_0xd4 + (long)p_Var5)));
          fVar16 = auVar23._0_4_ * fVar2;
          goto LAB_002c3896;
        }
      }
    }
  }
  return 0;
}

Assistant:

int HardSwish_x86_avx2::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            __m256 _zero = _mm256_set1_ps(0.f);
            __m256 _one = _mm256_set1_ps(1.f);
            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ans = _mm256_set1_ps(beta);
                _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
                _ans = _mm256_max_ps(_ans, _zero);
                _ans = _mm256_min_ps(_ans, _one);
                _ans = _mm256_mul_ps(_ans, _p);
                _mm256_storeu_ps(ptr, _ans);

                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            __m128 _zero = _mm_set1_ps(0.f);
            __m128 _one = _mm_set1_ps(1.f);
            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _ans = _mm_set1_ps(beta);
                _ans = _mm_add_ps(_mm_mul_ps(_p, _mm_set1_ps(alpha)), _ans);
                _ans = _mm_max_ps(_ans, _zero);
                _ans = _mm_min_ps(_ans, _one);
                _ans = _mm_mul_ps(_ans, _p);
                _mm_storeu_ps(ptr, _ans);

                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __AVX__
        __m256 _zero = _mm256_set1_ps(0.f);
        __m256 _one = _mm256_set1_ps(1.f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _ans = _mm256_set1_ps(beta);
            _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
            _ans = _mm256_max_ps(_ans, _zero);
            _ans = _mm256_min_ps(_ans, _one);
            _ans = _mm256_mul_ps(_ans, _p);
            _mm256_storeu_ps(ptr, _ans);

            ptr += 8;
        }
#endif
        for (; i < size; i++)
        {
            if (*ptr < lower)
                *ptr = 0.f;
            else if (*ptr > upper)
                ;
            else
                *ptr = *ptr * (*ptr * alpha + beta);
            ++ptr;
        }
    }

    return 0;
}